

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O1

string * __thiscall
re2::NFA::FormatCapture_abi_cxx11_(string *__return_storage_ptr__,NFA *this,char **capture)

{
  int iVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0 < this->ncapture_) {
    lVar2 = 0;
    do {
      if (capture[lVar2] == (char *)0x0) {
        StringAppendF(__return_storage_ptr__,"(?,?)");
      }
      else {
        iVar1 = (int)capture[lVar2];
        if (capture[lVar2 + 1] == (char *)0x0) {
          StringAppendF(__return_storage_ptr__,"(%d,?)",(ulong)(uint)(iVar1 - *(int *)&this->btext_)
                       );
        }
        else {
          StringAppendF(__return_storage_ptr__,"(%d,%d)",
                        (ulong)(uint)(iVar1 - *(int *)&this->btext_),
                        (ulong)(uint)((int)capture[lVar2 + 1] - *(int *)&this->btext_),in_R8,in_R9,
                        paVar3);
        }
      }
      lVar2 = lVar2 + 2;
    } while ((int)lVar2 < this->ncapture_);
  }
  return __return_storage_ptr__;
}

Assistant:

string NFA::FormatCapture(const char** capture) {
  string s;

  for (int i = 0; i < ncapture_; i+=2) {
    if (capture[i] == NULL)
      StringAppendF(&s, "(?,?)");
    else if (capture[i+1] == NULL)
      StringAppendF(&s, "(%d,?)", (int)(capture[i] - btext_));
    else
      StringAppendF(&s, "(%d,%d)",
                    (int)(capture[i] - btext_),
                    (int)(capture[i+1] - btext_));
  }
  return s;
}